

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datrie.c
# Opt level: O1

size_t dictionary_datrie_get_all_match_lengths
                 (dictionary_t t_dictionary,ucs4_t *word,size_t *match_length)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ucs4_t uVar8;
  uint uVar9;
  
  uVar8 = *word;
  if (uVar8 == 0) {
    return 0;
  }
  lVar2 = *t_dictionary;
  sVar5 = 1;
  sVar4 = 0;
  uVar6 = 0;
  while( true ) {
    iVar1 = *(int *)(lVar2 + uVar6 * 0xc);
    if (iVar1 == -1) {
      return sVar4;
    }
    uVar9 = iVar1 + uVar8;
    if ((((int)uVar9 < 0) || (*(uint *)((long)t_dictionary + 8) <= uVar9)) ||
       (uVar7 = (ulong)uVar9, uVar6 != (long)*(int *)(lVar2 + 4 + uVar7 * 0xc))) {
      bVar3 = false;
      uVar7 = uVar6;
    }
    else {
      bVar3 = true;
      if (*(int *)(lVar2 + uVar7 * 0xc + 8) != -1) {
        match_length[sVar4] = sVar5;
        sVar4 = sVar4 + 1;
      }
    }
    if (!bVar3) break;
    uVar8 = word[sVar5];
    sVar5 = sVar5 + 1;
    uVar6 = uVar7;
    if (uVar8 == 0) {
      return sVar4;
    }
  }
  return sVar4;
}

Assistant:

size_t dictionary_datrie_get_all_match_lengths(dictionary_t t_dictionary, const ucs4_t * word,
		size_t * match_length)
{
	datrie_dictionary_desc * datrie_dictionary = (datrie_dictionary_desc *) t_dictionary;

	size_t rscnt = 0;

	size_t i, p;
	for (i = 0,p = 0; word[p] && datrie_dictionary->dat[i].base != DATRIE_UNUSED; p ++)
	{
		int k = encode_char(word[p]);
		int j = datrie_dictionary->dat[i].base + k;
		if (j < 0 || j >= datrie_dictionary->dat_item_count || datrie_dictionary->dat[j].parent != i)
			break;
		i = j;

		if (datrie_dictionary->dat[i].word != -1)
			match_length[rscnt ++] = p + 1;
	}

	return rscnt;
}